

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O1

FSerializer * Serialize(FSerializer *arc,char *key,subsector_t **ss,subsector_t **param_4)

{
  bool bVar1;
  long lVar2;
  FSerializer *pFVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  byte bVar8;
  byte bVar9;
  char cVar10;
  byte *pbVar11;
  long lVar12;
  TArray<char,_char> encoded;
  char *str;
  int num_subs;
  TArray<char,_char> local_48;
  char *local_38;
  int local_2c;
  
  if (arc->w == (FWriter *)0x0) {
    bVar1 = FSerializer::BeginArray(arc,key);
    if (bVar1) {
      bVar1 = false;
      pFVar3 = Serialize(arc,(char *)0x0,(int32_t *)&local_48,(int32_t *)0x0);
      pFVar3 = Serialize(pFVar3,(char *)0x0,&local_2c,(int32_t *)0x0);
      pFVar3 = FSerializer::StringPtr(pFVar3,(char *)0x0,&local_38);
      FSerializer::EndArray(pFVar3);
      if ((int)local_48.Array == numvertexes) {
        if ((local_2c == numsubsectors) && (hasglnodes == true)) {
          cVar10 = *local_38;
          bVar1 = cVar10 == '\0';
          if (!bVar1) {
            lVar2 = 0x2c;
            lVar6 = 0;
            lVar4 = 0;
            do {
              bVar8 = cVar10 - 0x30;
              if (9 < bVar8) {
                if ((byte)(cVar10 + 0xbfU) < 0x1a) {
                  bVar8 = cVar10 - 0x37;
                }
                else if ((byte)(cVar10 + 0x9fU) < 0x1a) {
                  bVar8 = cVar10 - 0x3d;
                }
                else {
                  bVar8 = 0x3e;
                  if (cVar10 != '-') {
                    if (cVar10 != '+') goto LAB_0043f57f;
                    bVar8 = 0x3f;
                  }
                }
              }
              pbVar11 = (byte *)((long)&subsectors->sector + lVar2);
              lVar12 = 0;
              do {
                if ((lVar6 + lVar12 < (long)numsubsectors) &&
                   ((bVar8 >> ((uint)lVar12 & 0x1f) & 1) != 0)) {
                  *pbVar11 = *pbVar11 | 2;
                }
                lVar12 = lVar12 + 1;
                pbVar11 = pbVar11 + 0x30;
              } while (lVar12 != 6);
              lVar6 = lVar6 + 6;
              cVar10 = local_38[lVar4 + 1];
              lVar4 = lVar4 + 1;
              lVar2 = lVar2 + 0x120;
              bVar1 = cVar10 == '\0';
            } while (!bVar1);
          }
        }
        else {
LAB_0043f57f:
          bVar1 = false;
        }
      }
      if ((!bVar1) && (hasglnodes != false)) {
        RecalculateDrawnSubsectors();
      }
    }
  }
  else if (hasglnodes) {
    local_48.Most = (numsubsectors + 5) / 6 + 1;
    local_48.Count = 0;
    local_48.Array =
         (char *)M_Malloc_Dbg((long)(int)local_48.Most,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./tarray.h"
                              ,0x8c);
    uVar5 = (ulong)(uint)numsubsectors;
    if (numsubsectors < 1) {
      uVar7 = 0;
    }
    else {
      lVar2 = 0x2c;
      lVar6 = 0;
      uVar7 = 0;
      do {
        pbVar11 = (byte *)((long)&subsectors->sector + lVar2);
        lVar4 = 0;
        bVar8 = 0;
        do {
          if ((lVar6 + lVar4 < (long)(int)uVar5) && ((*pbVar11 & 2) != 0)) {
            bVar8 = bVar8 | (byte)(1 << ((byte)lVar4 & 0x1f));
          }
          lVar4 = lVar4 + 1;
          pbVar11 = pbVar11 + 0x30;
        } while (lVar4 != 6);
        if (bVar8 < 10) {
          bVar9 = bVar8 | 0x30;
        }
        else if (bVar8 < 0x24) {
          bVar9 = bVar8 + 0x37;
        }
        else if (bVar8 < 0x3e) {
          bVar9 = bVar8 + 0x3d;
        }
        else {
          bVar9 = 0x2d;
          if ((bVar8 != 0x3e) && (bVar9 = bVar8, bVar8 == 0x3f)) {
            bVar9 = 0x2b;
          }
        }
        local_48.Array[uVar7] = bVar9;
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + 6;
        uVar5 = (ulong)numsubsectors;
        lVar2 = lVar2 + 0x120;
      } while (lVar6 < (long)uVar5);
      uVar7 = uVar7 & 0xffffffff;
    }
    local_48.Array[uVar7] = '\0';
    local_38 = local_48.Array;
    bVar1 = FSerializer::BeginArray(arc,key);
    if (bVar1) {
      pFVar3 = Serialize(arc,(char *)0x0,&numvertexes,(int32_t *)0x0);
      pFVar3 = Serialize(pFVar3,(char *)0x0,&numsubsectors,(int32_t *)0x0);
      pFVar3 = FSerializer::StringPtr(pFVar3,(char *)0x0,&local_38);
      FSerializer::EndArray(pFVar3);
    }
    TArray<char,_char>::~TArray(&local_48);
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, subsector_t *&ss, subsector_t **)
{
	BYTE by;
	const char *str;

	if (arc.isWriting())
	{
		if (hasglnodes)
		{
			TArray<char> encoded(1 + (numsubsectors + 5) / 6);
			int p = 0;
			for (int i = 0; i < numsubsectors; i += 6)
			{
				by = 0;
				for (int j = 0; j < 6; j++)
				{
					if (i + j < numsubsectors && (subsectors[i + j].flags & SSECF_DRAWN))
					{
						by |= (1 << j);
					}
				}
				if (by < 10) by += '0';
				else if (by < 36) by += 'A' - 10;
				else if (by < 62) by += 'a' - 36;
				else if (by == 62) by = '-';
				else if (by == 63) by = '+';
				encoded[p++] = by;
			}
			encoded[p] = 0;
			str = &encoded[0];
			if (arc.BeginArray(key))
			{
				arc(nullptr, numvertexes)
					(nullptr, numsubsectors)
					.StringPtr(nullptr, str)
					.EndArray();
			}
		}
	}
	else
	{
		int num_verts, num_subs;
		bool success = false;
		if (arc.BeginArray(key))
		{
			arc(nullptr, num_verts)
				(nullptr, num_subs)
				.StringPtr(nullptr, str)
				.EndArray();

			if (num_verts == numvertexes && num_subs == numsubsectors && hasglnodes)
			{
				success = true;
				int sub = 0;
				for (int i = 0; str[i] != 0; i++)
				{
					by = str[i];
					if (by >= '0' && by <= '9') by -= '0';
					else if (by >= 'A' && by <= 'Z') by -= 'A' - 10;
					else if (by >= 'a' && by <= 'z') by -= 'a' - 36;
					else if (by == '-') by = 62;
					else if (by == '+') by = 63;
					else
					{
						success = false;
						break;
					}
					for (int s = 0; s < 6; s++)
					{
						if (sub + s < numsubsectors && (by & (1 << s)))
						{
							subsectors[sub + s].flags |= SSECF_DRAWN;
						}
					}
					sub += 6;
				}
			}
			if (hasglnodes && !success)
			{
				RecalculateDrawnSubsectors();
			}
		}

	}
	return arc;
}